

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3MIBufferFree(void *p)

{
  int iVar1;
  _func_void_sqlite3_mutex_ptr **pp_Var2;
  sqlite3_mutex *psVar3;
  
  psVar3 = (sqlite3_mutex *)((long)p - (ulong)*(uint *)((long)p + -4));
  if ((void *)((long)p + (0x1c - (ulong)*(uint *)((long)p + -4))) == p) {
    (psVar3->mutex).__size[1] = '\0';
  }
  else {
    (psVar3->mutex).__size[2] = '\0';
  }
  if ((((psVar3->mutex).__size[0] != '\0') || ((psVar3->mutex).__size[1] != '\0')) ||
     ((psVar3->mutex).__size[2] != '\0')) {
    return;
  }
  if (psVar3 == (sqlite3_mutex *)0x0) {
    return;
  }
  if (sqlite3Config.bMemstat == 0) {
    pp_Var2 = (_func_void_sqlite3_mutex_ptr **)&sqlite3Config.m.xFree;
  }
  else {
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
    }
    iVar1 = (*sqlite3Config.m.xSize)(psVar3);
    sqlite3Stat.nowValue[0] = sqlite3Stat.nowValue[0] - iVar1;
    sqlite3Stat.nowValue[9] = sqlite3Stat.nowValue[9] + -1;
    (*sqlite3Config.m.xFree)(psVar3);
    if (mem0.mutex == (sqlite3_mutex *)0x0) {
      return;
    }
    pp_Var2 = &sqlite3Config.mutex.xMutexLeave;
    psVar3 = mem0.mutex;
  }
  (**pp_Var2)(psVar3);
  return;
}

Assistant:

static void fts3MIBufferFree(void *p){
  MatchinfoBuffer *pBuf = (MatchinfoBuffer*)((u8*)p - ((u32*)p)[-1]);

  assert( (u32*)p==&pBuf->aMatchinfo[1] 
       || (u32*)p==&pBuf->aMatchinfo[pBuf->nElem+2] 
  );
  if( (u32*)p==&pBuf->aMatchinfo[1] ){
    pBuf->aRef[1] = 0;
  }else{
    pBuf->aRef[2] = 0;
  }

  if( pBuf->aRef[0]==0 && pBuf->aRef[1]==0 && pBuf->aRef[2]==0 ){
    sqlite3_free(pBuf);
  }
}